

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O1

void __thiscall cmDependsC::Scan(cmDependsC *this,istream *is,string *directory,string *fullName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  mapped_type pcVar5;
  mapped_type *ppcVar6;
  iterator iVar7;
  string line;
  UnscannedEntry entry;
  string local_e0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_c0;
  string local_b8;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *local_58;
  string *local_50;
  _Base_ptr local_48;
  mapped_type local_40;
  istream *local_38;
  
  local_50 = directory;
  local_38 = is;
  pcVar5 = (mapped_type)operator_new(0x20);
  *(undefined8 *)
   ((long)&(pcVar5->UnscannedEntries).
           super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(pcVar5->UnscannedEntries).
           super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (pcVar5->UnscannedEntries).
  super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar5->UnscannedEntries).
  super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar5->Used = true;
  ppcVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
            ::operator[](&this->FileCache,fullName);
  *ppcVar6 = pcVar5;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_e0.field_2;
  local_c0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->Encountered;
  local_48 = &(this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_58 = &this->Unscanned;
  local_40 = pcVar5;
  do {
    do {
      bVar3 = cmsys::SystemTools::GetLineFromStream(local_38,&local_b8,(bool *)0x0,-1);
      if (!bVar3) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
        return;
      }
      if ((this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        TransformLine(this,&local_b8);
      }
      bVar3 = cmsys::RegularExpression::find
                        (&this->IncludeRegexLine,local_b8._M_dataplus._M_p,
                         &(this->IncludeRegexLine).regmatch);
    } while (!bVar3);
    local_98._0_8_ = local_98 + 0x10;
    local_98._8_8_ = 0;
    local_98[0x10] = '\0';
    local_78._M_p = (pointer)&local_68;
    local_70 = 0;
    local_68._M_local_buf[0] = '\0';
    pcVar2 = (this->IncludeRegexLine).regmatch.startp[2];
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    if (pcVar2 == (char *)0x0) {
      local_e0._M_string_length = 0;
      local_e0.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,pcVar2,(this->IncludeRegexLine).regmatch.endp[2]);
    }
    std::__cxx11::string::operator=((string *)local_98,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes((string *)local_98);
    pcVar2 = (this->IncludeRegexLine).regmatch.startp[3];
    if (pcVar2 == (char *)0x0) {
      local_e0._M_string_length = 0;
      local_e0.field_2._M_local_buf[0] = '\0';
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,pcVar2,(this->IncludeRegexLine).regmatch.endp[3]);
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_e0);
    if (iVar4 == 0) {
      bVar3 = cmsys::SystemTools::FileIsFullPath((string *)local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,
                        CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                 local_e0.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar3) {
        cmSystemTools::CollapseCombinedPath(&local_e0,local_50,(string *)local_98);
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_e0);
        goto LAB_0035f0ed;
      }
    }
    else {
LAB_0035f0ed:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,
                        CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                 local_e0.field_2._M_local_buf[0]) + 1);
      }
    }
    bVar3 = cmsys::RegularExpression::find
                      (&this->IncludeRegexScan,(char *)local_98._0_8_,
                       &(this->IncludeRegexScan).regmatch);
    if (bVar3) {
      std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
      push_back(&local_40->UnscannedEntries,(value_type *)local_98);
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_c0,(key_type *)local_98);
      if (iVar7._M_node == local_48) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  (local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98);
        std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
        push_back(&local_58->c,(value_type *)local_98);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,
                      CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
    }
  } while( true );
}

Assistant:

void cmDependsC::Scan(std::istream& is, const std::string& directory,
                      const std::string& fullName)
{
  cmIncludeLines* newCacheEntry = new cmIncludeLines;
  newCacheEntry->Used = true;
  this->FileCache[fullName] = newCacheEntry;

  // Read one line at a time.
  std::string line;
  while (cmSystemTools::GetLineFromStream(is, line)) {
    // Transform the line content first.
    if (!this->TransformRules.empty()) {
      this->TransformLine(line);
    }

    // Match include directives.
    if (this->IncludeRegexLine.find(line)) {
      // Get the file being included.
      UnscannedEntry entry;
      entry.FileName = this->IncludeRegexLine.match(2);
      cmSystemTools::ConvertToUnixSlashes(entry.FileName);
      if (this->IncludeRegexLine.match(3) == "\"" &&
          !cmSystemTools::FileIsFullPath(entry.FileName)) {
        // This was a double-quoted include with a relative path.  We
        // must check for the file in the directory containing the
        // file we are scanning.
        entry.QuotedLocation =
          cmSystemTools::CollapseCombinedPath(directory, entry.FileName);
      }

      // Queue the file if it has not yet been encountered and it
      // matches the regular expression for recursive scanning.  Note
      // that this check does not account for the possibility of two
      // headers with the same name in different directories when one
      // is included by double-quotes and the other by angle brackets.
      // It also does not work properly if two header files with the same
      // name exist in different directories, and both are included from a
      // file their own directory by simply using "filename.h" (#12619)
      // This kind of problem will be fixed when a more
      // preprocessor-like implementation of this scanner is created.
      if (this->IncludeRegexScan.find(entry.FileName)) {
        newCacheEntry->UnscannedEntries.push_back(entry);
        if (this->Encountered.find(entry.FileName) ==
            this->Encountered.end()) {
          this->Encountered.insert(entry.FileName);
          this->Unscanned.push(entry);
        }
      }
    }
  }
}